

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O0

StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>
supermap::io::
DeserializeHelper<supermap::StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_void>
::deserialize(istream *is)

{
  Key<2UL> KVar1;
  ulong uVar2;
  IOException *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  StorageValueIgnorer<supermap::Key<2UL>,_supermap::ByteArray<3UL>_> svi;
  istream *in_stack_ffffffffffffffa8;
  string local_30 [16];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  KVar1 = deserialize<supermap::Key<2ul>,void>(in_stack_ffffffffffffffa8);
  std::istream::seekg((long)in_RDI,_S_end|_S_cur);
  uVar2 = std::ios::fail();
  if ((uVar2 & 1) == 0) {
    return (Key<2UL>)(Key<2UL>)KVar1.super_array<unsigned_char,_2UL>._M_elems;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  supermap::IOException::IOException(this,local_30);
  __cxa_throw(this,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

static StorageValueIgnorer<Key, Value> deserialize(std::istream &is) {
        StorageValueIgnorer<Key, Value> svi{io::deserialize<Key>(is)};
        is.seekg(FixedDeserializedSizeRegister<Value>::exactDeserializedSize, std::ios_base::cur);
        if (is.fail()) {
            throw IOException("StorageValueIgnorer deserialization fail: seekg failed");
        }
        return svi;
    }